

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_iterator.cpp
# Opt level: O2

void __thiscall
duckdb::BoundNodeVisitor::VisitExpressionChildren(BoundNodeVisitor *this,Expression *expr)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression_iterator.cpp:160:46)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression_iterator.cpp:160:46)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  ExpressionIterator::EnumerateChildren
            (expr,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                   *)&local_28);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void BoundNodeVisitor::VisitExpressionChildren(Expression &expr) {
	ExpressionIterator::EnumerateChildren(expr, [&](unique_ptr<Expression> &expr) { VisitExpression(expr); });
}